

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O1

bool __thiscall CDBWrapper::WriteBatch(CDBWrapper *this,CDBBatch *batch,bool fSync)

{
  DB *pDVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  size_t sVar4;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar5;
  double *in_R9;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string_view str;
  string_view logging_function;
  double mem_after;
  Status status;
  double mem_before;
  string log_msg;
  double local_f8;
  Status local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [3];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar3,LEVELDB,Debug);
  local_e8[0]._M_dataplus._M_p = (pointer)0x0;
  if (bVar2) {
    sVar4 = DynamicMemoryUsage(this);
    auVar6._8_4_ = (int)(sVar4 >> 0x20);
    auVar6._0_8_ = sVar4;
    auVar6._12_4_ = 0x45300000;
    local_e8[0]._M_dataplus._M_p =
         (pointer)(((auVar6._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 0.0009765625 *
                  0.0009765625);
  }
  puVar5 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pDVar1 = ((puVar5->_M_t).
            super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
            super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
            super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
  puVar5 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (*pDVar1->_vptr_DB[4])
            (&local_f0,pDVar1,
             &((puVar5->_M_t).
               super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
               super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
               super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->writeoptions + fSync,
             (batch->m_impl_batch)._M_t.
             super___uniq_ptr_impl<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_CDBBatch::WriteBatchImpl_*,_std::default_delete<CDBBatch::WriteBatchImpl>_>
             .super__Head_base<0UL,_CDBBatch::WriteBatchImpl_*,_false>._M_head_impl);
  HandleError(&local_f0);
  if (bVar2) {
    sVar4 = DynamicMemoryUsage(this);
    auVar7._8_4_ = (int)(sVar4 >> 0x20);
    auVar7._0_8_ = sVar4;
    auVar7._12_4_ = 0x45300000;
    local_f8 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 0.0009765625 *
               0.0009765625;
    pLVar3 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar3,LEVELDB,Debug);
    if (bVar2) {
      pLVar3 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar3);
      if (bVar2) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<std::__cxx11::string,double,double>
                  (&local_78,
                   (tinyformat *)"WriteBatch memory usage: db=%s, before=%.1fMiB, after=%.1fMiB\n",
                   (char *)&this->m_name,local_e8,&local_f8,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pLVar3 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x56;
        local_78._M_string_length = 0xfbbe2b;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp"
        ;
        source_file._M_len = 0x56;
        str._M_str = local_58._M_dataplus._M_p;
        str._M_len = local_58._M_string_length;
        logging_function._M_str = "WriteBatch";
        logging_function._M_len = 10;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x12f,LEVELDB,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  if (local_f0.state_ != (char *)0x0) {
    operator_delete__(local_f0.state_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::WriteBatch(CDBBatch& batch, bool fSync)
{
    const bool log_memory = LogAcceptCategory(BCLog::LEVELDB, BCLog::Level::Debug);
    double mem_before = 0;
    if (log_memory) {
        mem_before = DynamicMemoryUsage() / 1024.0 / 1024;
    }
    leveldb::Status status = DBContext().pdb->Write(fSync ? DBContext().syncoptions : DBContext().writeoptions, &batch.m_impl_batch->batch);
    HandleError(status);
    if (log_memory) {
        double mem_after = DynamicMemoryUsage() / 1024.0 / 1024;
        LogDebug(BCLog::LEVELDB, "WriteBatch memory usage: db=%s, before=%.1fMiB, after=%.1fMiB\n",
                 m_name, mem_before, mem_after);
    }
    return true;
}